

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O0

Matrix2f __thiscall Matrix2f::inverse(Matrix2f *this,bool *pbIsSingular,float epsilon)

{
  undefined1 *in_RDX;
  float fVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar3;
  double dVar4;
  Matrix2f MVar5;
  float reciprocalDeterminant;
  bool isSingular;
  float determinant;
  float epsilon_local;
  bool *pbIsSingular_local;
  Matrix2f *this_local;
  
  fVar1 = *(float *)pbIsSingular * *(float *)(pbIsSingular + 0xc) +
          -(*(float *)(pbIsSingular + 8) * *(float *)(pbIsSingular + 4));
  dVar4 = ABS((double)fVar1);
  if ((double)epsilon <= dVar4) {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 0;
    }
    fVar1 = 1.0 / fVar1;
    dVar4 = (double)(ulong)(uint)(-*(float *)(pbIsSingular + 8) * fVar1);
    Matrix2f(this,*(float *)(pbIsSingular + 0xc) * fVar1,-*(float *)(pbIsSingular + 8) * fVar1,
             -*(float *)(pbIsSingular + 4) * fVar1,*(float *)pbIsSingular * fVar1);
    uVar2 = extraout_XMM0_Da_00;
    uVar3 = extraout_XMM0_Db_00;
  }
  else {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 1;
    }
    Matrix2f(this,0.0);
    uVar2 = extraout_XMM0_Da;
    uVar3 = extraout_XMM0_Db;
  }
  MVar5.m_elements[1] = (float)uVar3;
  MVar5.m_elements[0] = (float)uVar2;
  MVar5.m_elements._8_8_ = dVar4;
  return (Matrix2f)MVar5.m_elements;
}

Assistant:

Matrix2f Matrix2f::inverse( bool* pbIsSingular, float epsilon )
{
	float determinant = m_elements[ 0 ] * m_elements[ 3 ] - m_elements[ 2 ] * m_elements[ 1 ];

	bool isSingular = ( fabs( determinant ) < epsilon );
	if( isSingular )
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = true;
		}
		return Matrix2f();
	}
	else
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = false;
		}

		float reciprocalDeterminant = 1.0f / determinant;

		return Matrix2f
		(
			m_elements[ 3 ] * reciprocalDeterminant, -m_elements[ 2 ] * reciprocalDeterminant,
			-m_elements[ 1 ] * reciprocalDeterminant, m_elements[ 0 ] * reciprocalDeterminant
		);
	}
}